

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

ErrorOr<llvm::MD5::MD5Result> *
llvm::sys::fs::md5_contents(ErrorOr<llvm::MD5::MD5Result> *__return_storage_ptr__,int FD)

{
  uint uVar1;
  ssize_t sVar2;
  uint *puVar3;
  error_category *peVar4;
  uchar *in_RCX;
  size_t in_RDX;
  undefined4 in_register_00000034;
  ArrayRef<unsigned_char> Data;
  error_code EC;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Buf;
  MD5Result Result;
  MD5 Hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  MD5Result local_c0;
  MD5 local_b0;
  
  MD5::MD5(&local_b0,(uchar *)CONCAT44(in_register_00000034,FD),in_RDX,in_RCX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,0x1000,
             (allocator_type *)&local_c0);
  while( true ) {
    sVar2 = read(FD,local_d8._M_impl.super__Vector_impl_data._M_start,0x1000);
    uVar1 = (uint)sVar2;
    if ((int)uVar1 < 1) break;
    Data.Length._0_4_ = uVar1 & 0x7fffffff;
    Data.Data = local_d8._M_impl.super__Vector_impl_data._M_start;
    Data.Length._4_4_ = 0;
    MD5::update(&local_b0,Data);
  }
  if ((int)uVar1 < 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    peVar4 = (error_category *)std::_V2::generic_category();
    EC._4_4_ = 0;
    EC._M_value = uVar1;
    EC._M_cat = peVar4;
    ErrorOr<llvm::MD5::MD5Result>::ErrorOr(__return_storage_ptr__,EC);
  }
  else {
    MD5::final(&local_b0,&local_c0);
    ErrorOr<llvm::MD5::MD5Result>::ErrorOr<llvm::MD5::MD5Result>
              (__return_storage_ptr__,&local_c0,(type *)0x0);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<MD5::MD5Result> md5_contents(int FD) {
  MD5 Hash;

  constexpr size_t BufSize = 4096;
  std::vector<uint8_t> Buf(BufSize);
  int BytesRead = 0;
  for (;;) {
    BytesRead = read(FD, Buf.data(), BufSize);
    if (BytesRead <= 0)
      break;
    Hash.update(makeArrayRef(Buf.data(), BytesRead));
  }

  if (BytesRead < 0)
    return std::error_code(errno, std::generic_category());
  MD5::MD5Result Result;
  Hash.final(Result);
  return Result;
}